

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitops.h
# Opt level: O2

uint8_t select_u8(uint32_t i,uint8_t *tab,uint32_t n)

{
  uint8_t uVar1;
  long lVar2;
  
  uVar1 = '\0';
  for (lVar2 = 0; lVar2 != 2; lVar2 = lVar2 + 1) {
    if (-1 < (char)((byte)i | -((byte)lVar2 ^ (byte)i))) {
      uVar1 = tab[lVar2];
    }
  }
  return uVar1;
}

Assistant:

static inline uint8_t select_u8(uint32_t i, volatile const uint8_t *tab, uint32_t n)
{
  uint8_t r = 0;
  uint32_t ii;

  for (ii = 0; ii < n; ii++)
  {
    uint8_t mask = mask_u8(i, ii);
    r = (r & ~mask) | (tab[ii] & mask);
  }

  return r;
}